

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::exitPhase1ResetDuals(HEkkDual *this)

{
  double dVar1;
  int iVar2;
  HEkk *pHVar3;
  pointer pdVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  ulong uVar6;
  uint uVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  HighsLogOptions *log_options_;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  
  pHVar3 = this->ekk_instance_;
  log_options_ = &(pHVar3->options_->super_HighsOptionsStruct).log_options;
  if ((pHVar3->info_).costs_perturbed == true) {
    highsLogDev(log_options_,kInfo,"Costs are already perturbed in exitPhase1ResetDuals\n");
  }
  else {
    highsLogDev(log_options_,kDetailed,"Re-perturbing costs when optimal in phase 1\n");
    HEkk::initialiseCost(this->ekk_instance_,kDual,2,true);
    HEkk::computeDual(this->ekk_instance_);
  }
  iVar2 = (pHVar3->lp_).num_row_;
  uVar7 = iVar2 + (pHVar3->lp_).num_col_;
  if (uVar7 != 0 && SCARRY4(iVar2,(pHVar3->lp_).num_col_) == (int)uVar7 < 0) {
    dVar11 = 0.0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      if ((pHVar3->basis_).nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] != '\0') {
        iVar2 = (pHVar3->lp_).num_col_;
        pvVar8 = &(pHVar3->lp_).row_upper_;
        pvVar5 = &(pHVar3->lp_).row_lower_;
        uVar6 = (long)((int)uVar10 - iVar2);
        if ((long)uVar10 < (long)iVar2) {
          pvVar8 = &(pHVar3->lp_).col_upper_;
          pvVar5 = &(pHVar3->lp_).col_lower_;
          uVar6 = uVar10;
        }
        if (((pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar6] <= -INFINITY) &&
           (INFINITY <=
            (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6])) {
          pdVar4 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar1 = pdVar4[uVar10];
          pdVar4[uVar10] = 0.0;
          pdVar4 = (pHVar3->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar4[uVar10] = pdVar4[uVar10] - dVar1;
          uVar9 = uVar9 + 1;
          dVar11 = dVar11 + ABS(dVar1);
          highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                      kVerbose,"Variable %d is free: shift cost to zero dual of %g\n",-dVar1,
                      uVar10 & 0xffffffff);
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
    if (uVar9 != 0) {
      highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
                  "Performed %d cost shift(s) for free variables to zero dual values: total = %g\n",
                  dVar11,(ulong)uVar9);
      (pHVar3->info_).costs_shifted = true;
    }
  }
  return;
}

Assistant:

void HEkkDual::exitPhase1ResetDuals() {
  const HighsLp& lp = ekk_instance_.lp_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  // This use of costs_alt_perturbed is not executed by ctest
  //
  //  assert(99==2);
  if (info.costs_perturbed) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "Costs are already perturbed in exitPhase1ResetDuals\n");
  } else {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "Re-perturbing costs when optimal in phase 1\n");
    ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhase2, true);
    ekk_instance_.computeDual();
  }

  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  HighsInt num_shift = 0;
  double sum_shift = 0;
  for (HighsInt iVar = 0; iVar < numTot; iVar++) {
    if (basis.nonbasicFlag_[iVar]) {
      double lp_lower;
      double lp_upper;
      if (iVar < lp.num_col_) {
        lp_lower = lp.col_lower_[iVar];
        lp_upper = lp.col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - lp.num_col_;
        lp_lower = lp.row_lower_[iRow];
        lp_upper = lp.row_upper_[iRow];
      }
      if (lp_lower <= -kHighsInf && lp_upper >= kHighsInf) {
        const double shift = -info.workDual_[iVar];
        info.workDual_[iVar] = 0;
        info.workCost_[iVar] = info.workCost_[iVar] + shift;
        num_shift++;
        sum_shift += fabs(shift);
        highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kVerbose,
                    "Variable %" HIGHSINT_FORMAT
                    " is free: shift cost to zero dual of %g\n",
                    iVar, shift);
      }
    }
  }
  if (num_shift) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "Performed %" HIGHSINT_FORMAT
                " cost shift(s) for free variables to zero "
                "dual values: total = %g\n",
                num_shift, sum_shift);
    info.costs_shifted = true;
  }
}